

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

path * Omega_h::vtk::piece_filename(path *__return_storage_ptr__,path *piecepath,I32 rank)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)piecepath);
  filesystem::path::operator+=(__return_storage_ptr__,'_');
  std::__cxx11::to_string(&sStack_38,rank);
  filesystem::path::operator+=(__return_storage_ptr__,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  filesystem::path::operator+=(__return_storage_ptr__,".vtu");
  return __return_storage_ptr__;
}

Assistant:

static filesystem::path piece_filename(
    filesystem::path const& piecepath, I32 rank) {
  auto piece_filename = piecepath;
  piece_filename += '_';
  piece_filename += std::to_string(rank);
  piece_filename += ".vtu";
  return piece_filename;
}